

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ecdsa_recoverable_signature_load
               (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
               secp256k1_ecdsa_recoverable_signature *sig)

{
  secp256k1_ecdsa_recoverable_signature *sig_local;
  int *recid_local;
  secp256k1_scalar *s_local;
  secp256k1_scalar *r_local;
  secp256k1_context *ctx_local;
  
  r->d[0] = *(uint64_t *)sig->data;
  r->d[1] = *(uint64_t *)(sig->data + 8);
  r->d[2] = *(uint64_t *)(sig->data + 0x10);
  r->d[3] = *(uint64_t *)(sig->data + 0x18);
  s->d[0] = *(uint64_t *)(sig->data + 0x20);
  s->d[1] = *(uint64_t *)(sig->data + 0x28);
  s->d[2] = *(uint64_t *)(sig->data + 0x30);
  s->d[3] = *(uint64_t *)(sig->data + 0x38);
  *recid = (uint)sig->data[0x40];
  return;
}

Assistant:

static void secp256k1_ecdsa_recoverable_signature_load(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const secp256k1_ecdsa_recoverable_signature* sig) {
    (void)ctx;
    if (sizeof(secp256k1_scalar) == 32) {
        /* When the secp256k1_scalar type is exactly 32 byte, use its
         * representation inside secp256k1_ecdsa_signature, as conversion is very fast.
         * Note that secp256k1_ecdsa_signature_save must use the same representation. */
        memcpy(r, &sig->data[0], 32);
        memcpy(s, &sig->data[32], 32);
    } else {
        secp256k1_scalar_set_b32(r, &sig->data[0], NULL);
        secp256k1_scalar_set_b32(s, &sig->data[32], NULL);
    }
    *recid = sig->data[64];
}